

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::pipeline::anon_unknown_0::AlphaToCoverageInstance::verifyImage
          (TestStatus *__return_storage_ptr__,AlphaToCoverageInstance *this,
          ConstPixelBufferAccess *result)

{
  GeometryType GVar1;
  undefined4 uVar2;
  int iVar3;
  float *pfVar4;
  ostream *poVar5;
  allocator<char> local_219;
  string local_218;
  string local_1f8;
  undefined1 local_1d4 [36];
  ostringstream message;
  undefined1 local_3c [24];
  int x;
  int y;
  float maxColorValue;
  ConstPixelBufferAccess *result_local;
  AlphaToCoverageInstance *this_local;
  
  GVar1 = this->m_geometryType;
  if (GVar1 == GEOMETRY_TYPE_OPAQUE_QUAD) {
    x = 0x3f8147ae;
  }
  else if (GVar1 == GEOMETRY_TYPE_TRANSLUCENT_QUAD) {
    x = 0x3f051eb8;
  }
  else if (GVar1 == GEOMETRY_TYPE_INVISIBLE_QUAD) {
    x = 0x3c23d70a;
  }
  else {
    x = 0;
  }
  local_3c._20_4_ = 0;
  _y = result;
  result_local = (ConstPixelBufferAccess *)this;
  this_local = (AlphaToCoverageInstance *)__return_storage_ptr__;
  do {
    uVar2 = local_3c._20_4_;
    iVar3 = tcu::Vector<int,_2>::y(&this->m_renderSize);
    if (iVar3 <= (int)uVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_218,"Image matches reference value",&local_219);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      std::allocator<char>::~allocator(&local_219);
      return __return_storage_ptr__;
    }
    for (local_3c._16_4_ = 0; uVar2 = local_3c._16_4_,
        iVar3 = tcu::Vector<int,_2>::x(&this->m_renderSize), (int)uVar2 < iVar3;
        local_3c._16_4_ = local_3c._16_4_ + 1) {
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)local_3c,(int)_y,local_3c._16_4_,local_3c._20_4_);
      pfVar4 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_3c);
      if ((float)x < *pfVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d4 + 0x1c));
        poVar5 = std::operator<<((ostream *)(local_1d4 + 0x1c),
                                 "Pixel is not below the threshold value (");
        tcu::ConstPixelBufferAccess::getPixel
                  ((ConstPixelBufferAccess *)local_1d4,(int)_y,local_3c._16_4_,local_3c._20_4_);
        pfVar4 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_1d4);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pfVar4);
        poVar5 = std::operator<<(poVar5," > ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(float)x);
        std::operator<<(poVar5,")");
        std::__cxx11::ostringstream::str();
        tcu::TestStatus::fail(__return_storage_ptr__,&local_1f8);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1d4 + 0x1c));
        return __return_storage_ptr__;
      }
    }
    local_3c._20_4_ = local_3c._20_4_ + 1;
  } while( true );
}

Assistant:

tcu::TestStatus AlphaToCoverageInstance::verifyImage (const tcu::ConstPixelBufferAccess&	result)
{
	float maxColorValue;

	switch (m_geometryType)
	{
		case GEOMETRY_TYPE_OPAQUE_QUAD:
			maxColorValue = 1.01f;
			break;

		case GEOMETRY_TYPE_TRANSLUCENT_QUAD:
			maxColorValue = 0.52f;
			break;

		case GEOMETRY_TYPE_INVISIBLE_QUAD:
			maxColorValue = 0.01f;
			break;

		default:
			maxColorValue = 0.0f;
			DE_ASSERT(false);
	}

	for (int y = 0; y < m_renderSize.y(); y++)
	{
		for (int x = 0; x < m_renderSize.x(); x++)
		{
			if (result.getPixel(x, y).x() > maxColorValue)
			{
				std::ostringstream message;
				message << "Pixel is not below the threshold value (" << result.getPixel(x, y).x() << " > " << maxColorValue << ")";
				return tcu::TestStatus::fail(message.str());
			}
		}
	}

	return tcu::TestStatus::pass("Image matches reference value");
}